

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O1

void __thiscall
ary::SceneAnchor::SceneAnchor(SceneAnchor *this,string *name,Matx44f *transform,int group)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  this->_vptr_SceneAnchor = (_func_int **)&PTR__SceneAnchor_001269e8;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  uVar2 = *(undefined8 *)transform->val;
  uVar3 = *(undefined8 *)(transform->val + 2);
  uVar4 = *(undefined8 *)(transform->val + 4);
  uVar5 = *(undefined8 *)(transform->val + 6);
  uVar6 = *(undefined8 *)(transform->val + 8);
  uVar7 = *(undefined8 *)(transform->val + 10);
  uVar8 = *(undefined8 *)(transform->val + 0xe);
  *(undefined8 *)((this->transform).val + 0xc) = *(undefined8 *)(transform->val + 0xc);
  *(undefined8 *)((this->transform).val + 0xe) = uVar8;
  *(undefined8 *)((this->transform).val + 8) = uVar6;
  *(undefined8 *)((this->transform).val + 10) = uVar7;
  *(undefined8 *)((this->transform).val + 4) = uVar4;
  *(undefined8 *)((this->transform).val + 6) = uVar5;
  *(undefined8 *)(this->transform).val = uVar2;
  *(undefined8 *)((this->transform).val + 2) = uVar3;
  this->group = group;
  return;
}

Assistant:

SceneAnchor::SceneAnchor(const string name, const Matx44f& transform, int group) : name(name), transform(transform), group(group) {

}